

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_UInt32 * tt_cmap14_variant_chars(TT_CMap cmap,FT_Memory memory,FT_UInt32 variantSelector)

{
  FT_Byte *pFVar1;
  FT_CMap_Class pFVar2;
  FT_UInt FVar3;
  FT_Error FVar4;
  uint *puVar5;
  FT_UInt32 *pFVar6;
  int iVar7;
  ulong uVar8;
  FT_Byte *p;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  FT_UInt32 FVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  byte *pbVar20;
  bool bVar21;
  ulong uVar19;
  
  pFVar1 = cmap->data;
  puVar5 = (uint *)tt_cmap14_find_variant(pFVar1 + 6,variantSelector);
  if (puVar5 != (uint *)0x0) {
    uVar10 = *puVar5;
    uVar18 = puVar5[1];
    uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
    uVar8 = (ulong)uVar10;
    uVar18 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
    uVar19 = (ulong)uVar18;
    if (uVar10 != 0 || uVar18 != 0) {
      if (uVar8 == 0) {
LAB_00158f29:
        pFVar6 = tt_cmap14_get_nondef_chars(cmap,pFVar1 + uVar19,memory);
        return pFVar6;
      }
      if (uVar19 != 0) {
        p = pFVar1 + uVar8;
        uVar10 = *(uint *)(pFVar1 + uVar19);
        uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18
        ;
        FVar3 = tt_cmap14_def_char_count(p);
        if (uVar10 != 0) {
          if (FVar3 != 0) {
            uVar18 = *(uint *)(pFVar1 + uVar8);
            FVar4 = tt_cmap14_ensure((TT_CMap14)cmap,FVar3 + uVar10 + 1,memory);
            uVar8 = 0;
            if (FVar4 != 0) {
              return (FT_UInt32 *)0x0;
            }
            uVar17 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                     uVar18 << 0x18;
            pFVar2 = cmap[1].cmap.clazz;
            FVar12 = (uint)p[6] | (uint)p[5] << 8 | (uint)p[4] << 0x10;
            uVar13 = (uint)p[7];
            pbVar9 = p + 8;
            uVar14 = (uint)pFVar1[uVar19 + 6] |
                     (uint)pFVar1[uVar19 + 5] << 8 | (uint)pFVar1[uVar19 + 4] << 0x10;
            pbVar20 = pFVar1 + uVar19 + 9;
            uVar18 = 1;
            uVar11 = 1;
            while( true ) {
              while( true ) {
                iVar7 = (int)uVar8;
                if (uVar13 + FVar12 < uVar14) break;
                if (uVar14 < FVar12) {
                  uVar8 = (ulong)(iVar7 + 1);
                  *(uint *)((long)&pFVar2->size + (long)iVar7 * 4) = uVar14;
                }
                iVar7 = (int)uVar8;
                uVar11 = uVar11 + 1;
                if (uVar10 < uVar11) goto LAB_00158f7a;
                uVar14 = (uint)pbVar20[2] | (uint)pbVar20[1] << 8 | (uint)*pbVar20 << 0x10;
                pbVar20 = pbVar20 + 5;
              }
              for (lVar16 = 0; iVar15 = (int)lVar16, uVar13 + 1 != iVar15; lVar16 = lVar16 + 1) {
                *(FT_UInt32 *)((long)&pFVar2->size + lVar16 * 4 + (long)iVar7 * 4) = FVar12 + iVar15
                ;
              }
              uVar18 = uVar18 + 1;
              if (uVar17 < uVar18) break;
              uVar8 = (uVar8 & 0xffffffff) + lVar16;
              FVar12 = (uint)pbVar9[2] | (uint)pbVar9[1] << 8 | (uint)*pbVar9 << 0x10;
              uVar13 = (uint)pbVar9[3];
              pbVar9 = pbVar9 + 4;
            }
            iVar7 = iVar7 + iVar15;
LAB_00158f7a:
            if (uVar10 < uVar11) {
              if (uVar18 <= uVar17) {
                lVar16 = (long)iVar7;
                iVar7 = uVar13 + 1;
                while (bVar21 = iVar7 != 0, iVar7 = iVar7 + -1, bVar21) {
                  *(FT_UInt32 *)((long)&pFVar2->size + lVar16 * 4) = FVar12;
                  lVar16 = lVar16 + 1;
                  FVar12 = FVar12 + 1;
                }
                for (; iVar7 = (int)lVar16, uVar18 < uVar17; uVar18 = uVar18 + 1) {
                  FVar12 = (uint)pbVar9[2] | (uint)pbVar9[1] << 8 | (uint)*pbVar9 << 0x10;
                  lVar16 = (long)iVar7;
                  iVar7 = pbVar9[3] + 1;
                  while (bVar21 = iVar7 != 0, iVar7 = iVar7 + -1, bVar21) {
                    *(FT_UInt32 *)((long)&pFVar2->size + lVar16 * 4) = FVar12;
                    lVar16 = lVar16 + 1;
                    FVar12 = FVar12 + 1;
                  }
                  pbVar9 = pbVar9 + 4;
                }
              }
            }
            else {
              pFVar6 = (FT_UInt32 *)((long)&pFVar2->size + (long)iVar7 * 4);
              *pFVar6 = uVar14;
              while( true ) {
                iVar7 = iVar7 + 1;
                pFVar6 = pFVar6 + 1;
                if (uVar10 <= uVar11) break;
                *pFVar6 = (uint)pbVar20[2] | (uint)pbVar20[1] << 8 | (uint)*pbVar20 << 0x10;
                pbVar20 = pbVar20 + 5;
                uVar11 = uVar11 + 1;
              }
            }
            *(FT_UInt32 *)((long)&pFVar2->size + (long)iVar7 * 4) = 0;
            return (FT_UInt32 *)pFVar2;
          }
          goto LAB_00158f29;
        }
      }
      pFVar6 = tt_cmap14_get_def_chars(cmap,pFVar1 + uVar8,memory);
      return pFVar6;
    }
  }
  return (FT_UInt32 *)0x0;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 * )
  tt_cmap14_variant_chars( TT_CMap    cmap,
                           FT_Memory  memory,
                           FT_UInt32  variantSelector )
  {
    FT_Byte    *p  = tt_cmap14_find_variant( cmap->data + 6,
                                             variantSelector );
    FT_Int      i;
    FT_ULong    defOff;
    FT_ULong    nondefOff;


    if ( !p )
      return NULL;

    defOff    = TT_NEXT_ULONG( p );
    nondefOff = TT_NEXT_ULONG( p );

    if ( defOff == 0 && nondefOff == 0 )
      return NULL;

    if ( defOff == 0 )
      return tt_cmap14_get_nondef_chars( cmap, cmap->data + nondefOff,
                                         memory );
    else if ( nondefOff == 0 )
      return tt_cmap14_get_def_chars( cmap, cmap->data + defOff,
                                      memory );
    else
    {
      /* Both a default and a non-default glyph set?  That's probably not */
      /* good font design, but the spec allows for it...                  */
      TT_CMap14  cmap14 = (TT_CMap14) cmap;
      FT_UInt32  numRanges;
      FT_UInt32  numMappings;
      FT_UInt32  duni;
      FT_UInt32  dcnt;
      FT_UInt32  nuni;
      FT_Byte*   dp;
      FT_UInt    di, ni, k;

      FT_UInt32  *ret;


      p  = cmap->data + nondefOff;
      dp = cmap->data + defOff;

      numMappings = (FT_UInt32)TT_NEXT_ULONG( p );
      dcnt        = tt_cmap14_def_char_count( dp );
      numRanges   = (FT_UInt32)TT_NEXT_ULONG( dp );

      if ( numMappings == 0 )
        return tt_cmap14_get_def_chars( cmap, cmap->data + defOff,
                                        memory );
      if ( dcnt == 0 )
        return tt_cmap14_get_nondef_chars( cmap, cmap->data + nondefOff,
                                           memory );

      if ( tt_cmap14_ensure( cmap14, ( dcnt + numMappings + 1 ), memory ) )
        return NULL;

      ret  = cmap14->results;
      duni = (FT_UInt32)TT_NEXT_UINT24( dp );
      dcnt = FT_NEXT_BYTE( dp );
      di   = 1;
      nuni = (FT_UInt32)TT_NEXT_UINT24( p );
      p   += 2;
      ni   = 1;
      i    = 0;

      for (;;)
      {
        if ( nuni > duni + dcnt )
        {
          for ( k = 0; k <= dcnt; k++ )
            ret[i++] = duni + k;

          di++;

          if ( di > numRanges )
            break;

          duni = (FT_UInt32)TT_NEXT_UINT24( dp );
          dcnt = FT_NEXT_BYTE( dp );
        }
        else
        {
          if ( nuni < duni )
            ret[i++] = nuni;
          /* If it is within the default range then ignore it -- */
          /* that should not have happened                       */
          ni++;
          if ( ni > numMappings )
            break;

          nuni = (FT_UInt32)TT_NEXT_UINT24( p );
          p += 2;
        }
      }

      if ( ni <= numMappings )
      {
        /* If we get here then we have run out of all default ranges.   */
        /* We have read one non-default mapping which we haven't stored */
        /* and there may be others that need to be read.                */
        ret[i++] = nuni;
        while ( ni < numMappings )
        {
          ret[i++] = (FT_UInt32)TT_NEXT_UINT24( p );
          p += 2;
          ni++;
        }
      }
      else if ( di <= numRanges )
      {
        /* If we get here then we have run out of all non-default     */
        /* mappings.  We have read one default range which we haven't */
        /* stored and there may be others that need to be read.       */
        for ( k = 0; k <= dcnt; k++ )
          ret[i++] = duni + k;

        while ( di < numRanges )
        {
          duni = (FT_UInt32)TT_NEXT_UINT24( dp );
          dcnt = FT_NEXT_BYTE( dp );

          for ( k = 0; k <= dcnt; k++ )
            ret[i++] = duni + k;
          di++;
        }
      }

      ret[i] = 0;

      return ret;
    }
  }